

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O0

Def * __thiscall hdc::Def::getUniqueCppName_abi_cxx11_(Def *this)

{
  bool bVar1;
  ostream *poVar2;
  Def *in_RSI;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [56];
  stringstream s;
  ostream local_190 [384];
  Def *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1d0 + 0x30));
  bVar1 = isMethod(in_RSI);
  if (bVar1) {
    poVar2 = std::operator<<(local_190,"m");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI->id);
    poVar2 = std::operator<<(poVar2,"_");
    getName_abi_cxx11_((Def *)local_1d0);
    std::operator<<(poVar2,(string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  else {
    poVar2 = std::operator<<(local_190,"d");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI->id);
    poVar2 = std::operator<<(poVar2,"_");
    getName_abi_cxx11_((Def *)local_1f0);
    std::operator<<(poVar2,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d0 + 0x30));
  return this;
}

Assistant:

std::string Def::getUniqueCppName() {
    std::stringstream s;

    if (isMethod()) {
        s << "m" << id << "_" << getName();
    } else {
        s << "d" << id << "_" << getName();
    }

    return s.str();
}